

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O2

basic_json_pointer<char> *
jsoncons::jsonpointer::operator+
          (basic_json_pointer<char> *__return_storage_ptr__,basic_json_pointer<char> *lhs,
          basic_json_pointer<char> *rhs)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->tokens_,&lhs->tokens_);
  basic_json_pointer<char>::operator+=(__return_storage_ptr__,rhs);
  return __return_storage_ptr__;
}

Assistant:

basic_json_pointer<CharT> operator+( const basic_json_pointer<CharT>& lhs, const basic_json_pointer<CharT>& rhs )
        {
            basic_json_pointer<CharT> p(lhs);
            p += rhs;
            return p;
        }